

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitIO.cpp
# Opt level: O2

bool __thiscall BitOutStream::zeroByteEnd(BitOutStream *this)

{
  pointer *ppuVar1;
  pointer data;
  uchar uVar2;
  pointer puVar3;
  
  data = (this->out).data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
  puVar3 = (this->out).data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish + -1;
  (this->out).data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar3;
  uVar2 = CRC::Calculate<unsigned_char,(unsigned_short)8>
                    (data,(long)puVar3 - (long)data,
                     (Parameters<unsigned_char,_(unsigned_short)8> *)&CRC::CRC_8()::parameters);
  if (uVar2 == '\0') {
    ppuVar1 = &(this->out).data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + -1;
    this->nBitsDone = -1;
  }
  return uVar2 == '\0';
}

Assistant:

bool BitOutStream::zeroByteEnd(){
    //remove the trailing 1 added during encoding to not have a zero byte crc
    out.data.pop_back();
    if (CRC::Calculate(out.data.data(), out.data.size() * sizeof(char), CRC::CRC_8()) != 0){
        return false;
    } else {
        // remove the bytecount and set nBitsDone to -1, indicating that the decoding is done
        out.data.pop_back();
        nBitsDone = -1;
        return true;
    }
}